

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O2

void __thiscall NetQuantize::NetQuantize(NetQuantize *this)

{
  _Rb_tree_header *p_Var1;
  
  ModelWriter::ModelWriter(&this->super_ModelWriter);
  (this->super_ModelWriter).super_Net._vptr_Net = (_func_int **)&PTR__NetQuantize_00565fc0;
  p_Var1 = &(this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header;
  (this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header;
  (this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

NetQuantize::NetQuantize()
    : ModelWriter()
{
}